

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh,int64_t *index)

{
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018bb198;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018b6ab8,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018b67b8;
  pzgeom::TPZNodeRep<1,_pztopology::TPZPoint>::TPZNodeRep
            ((TPZNodeRep<1,_pztopology::TPZPoint> *)&this->fGeo,&PTR_PTR_018b6720,nodeindices);
  (this->fGeo).super_TPZGeoPoint.super_TPZNodeRep<1,_pztopology::TPZPoint>.super_TPZPoint.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_018b66c0;
  (this->fGeo).fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_018a3510;
  (this->fGeo).fNeighbours[0].fSide = -1;
  (this->fGeo).fNeighbours[0].fGeoElIndex = -1;
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&(this->fGeo).field_0x30);
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_018a3510;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  (this->fGeo).fGeoEl = &this->super_TPZGeoEl;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}